

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_IDENTIFY(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  object *local_10;
  
  context->ident = true;
  if (context->cmd == (command *)0x0) {
    _Var1 = get_item(&local_10,"Identify which item? ","You have nothing to identify.",CMD_NULL,
                     item_tester_unknown,L'\x0f');
    if (!_Var1) {
      return false;
    }
  }
  else {
    wVar2 = cmd_get_item((command_conflict *)context->cmd,"tgtitem",&local_10,
                         "Identify which item? ","You have nothing to identify.",item_tester_unknown
                         ,L'\x0f');
    if (wVar2 != L'\0') {
      return false;
    }
  }
  object_learn_unknown_rune(player,local_10,true);
  return true;
}

Assistant:

bool effect_handler_IDENTIFY(effect_handler_context_t *context)
{
	struct object *obj;
	const char *q, *s;
	int itemmode = (USE_EQUIP | USE_INVEN | USE_QUIVER | USE_FLOOR);
	bool used = false;

	context->ident = true;

	/* Get an item */
	q = "Identify which item? ";
	s = "You have nothing to identify.";
	if (context->cmd) {
		if (cmd_get_item(context->cmd, "tgtitem", &obj, q, s,
				item_tester_unknown, itemmode)) {
			return used;
		}
	} else if (!get_item(&obj, q, s, 0, item_tester_unknown, itemmode))
		return used;

	/* Identify the object */
	object_learn_unknown_rune(player, obj, true);

	return true;
}